

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_dup32_m68k(void *d,uint32_t desc,uint32_t c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  
  auVar3 = _DAT_00d58680;
  auVar2 = _DAT_00d58670;
  auVar1 = _DAT_00d58660;
  if (c == 0) {
    uVar6 = desc >> 2 & 0xf8;
    uVar5 = 0;
  }
  else {
    uVar4 = desc * 8 & 0xff;
    uVar5 = (ulong)(uVar4 + 8);
    uVar6 = desc * 2 & 0x3e;
    uVar7 = uVar6 + 1;
    auVar9._4_4_ = 0;
    auVar9._0_4_ = uVar7;
    auVar9._8_4_ = uVar7;
    auVar9._12_4_ = 0;
    uVar8 = 0;
    auVar9 = auVar9 | _DAT_00d58680;
    do {
      auVar11._8_4_ = (int)uVar8;
      auVar11._0_8_ = uVar8;
      auVar11._12_4_ = (int)(uVar8 >> 0x20);
      auVar12 = (auVar11 | auVar2) ^ auVar3;
      iVar10 = auVar9._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ || iVar10 < auVar12._4_4_
                  ) & 1)) {
        *(uint32_t *)((long)d + uVar8 * 4) = c;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        *(uint32_t *)((long)d + uVar8 * 4 + 4) = c;
      }
      auVar11 = (auVar11 | auVar1) ^ auVar3;
      iVar13 = auVar11._4_4_;
      if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
        *(uint32_t *)((long)d + uVar8 * 4 + 8) = c;
        *(uint32_t *)((long)d + uVar8 * 4 + 0xc) = c;
      }
      uVar8 = uVar8 + 4;
    } while ((uVar6 + 5 & 0xfffffffc) != uVar8);
    uVar6 = desc >> 2 & 0xf8;
    if (uVar6 <= uVar4) {
      return;
    }
  }
  uVar8 = (ulong)(uVar6 + 8);
  if ((ulong)(uVar6 + 8) < uVar5 + 8) {
    uVar8 = uVar5 + 8;
  }
  memset((void *)((long)d + uVar5),0,(~uVar5 + uVar8 & 0xfffffffffffffff8) + 8);
  return;
}

Assistant:

void HELPER(gvec_dup32)(void *d, uint32_t desc, uint32_t c)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    if (c == 0) {
        oprsz = 0;
    } else {
        for (i = 0; i < oprsz; i += sizeof(uint32_t)) {
            *(uint32_t *)((char *)d + i) = c;
        }
    }
    clear_high(d, oprsz, desc);
}